

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

MPP_RET set_output_frame(Av1CodecContext *ctx)

{
  RK_S32 RVar1;
  MppFrame pvStack_28;
  MPP_RET ret;
  MppFrame frame;
  AV1Context *s;
  Av1CodecContext *ctx_local;
  
  frame = ctx->priv_data;
  pvStack_28 = (MppFrame)0x0;
  s = (AV1Context *)ctx;
  if ((*(int *)((long)frame + 0x1b98) == 0) ||
     (RVar1 = mpp_log2(*(int *)((long)frame + 0x1b98) >> 8), RVar1 <= *(int *)((long)frame + 0x1884)
     )) {
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)frame + 0x1dba8),*(RK_S32 *)((long)frame + 0x1870),
               SLOT_FRAME_PTR,&stack0xffffffffffffffd8);
    if ((*(long *)((long)frame + 0x1b80) != 0) && (*(int *)((long)frame + 0x1b88) != 0)) {
      mpp_frame_set_hdr_dynamic_meta(pvStack_28,*(MppFrameHdrDynamicMeta **)((long)frame + 0x1b80));
      *(undefined4 *)((long)frame + 0x1b88) = 0;
      if (**(char **)((long)frame + 0x68) != '\0') {
        fill_hdr_meta_to_frame(pvStack_28,MPP_VIDEO_CodingAV1);
      }
    }
    mpp_frame_set_pts(pvStack_28,*(RK_S64 *)((long)frame + 0x1dbd8));
    mpp_buf_slot_set_flag
              (*(MppBufSlots *)((long)frame + 0x1dba8),*(RK_S32 *)((long)frame + 0x1870),
               SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue
              (*(MppBufSlots *)((long)frame + 0x1dba8),*(RK_S32 *)((long)frame + 0x1870),
               QUEUE_DISPLAY);
    *(undefined4 *)(*(long *)((long)frame + 7000) + 8) = 1;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET set_output_frame(Av1CodecContext *ctx)
{
    AV1Context *s = ctx->priv_data;
    MppFrame frame = NULL;
    MPP_RET ret = MPP_OK;

    // TODO: all layers
    if (s->operating_point_idc &&
        mpp_log2(s->operating_point_idc >> 8) > s->cur_frame.spatial_id)
        return 0;
    mpp_buf_slot_get_prop(s->slots, s->cur_frame.slot_index, SLOT_FRAME_PTR, &frame);
    if (s->hdr_dynamic_meta && s->hdr_dynamic) {
        mpp_frame_set_hdr_dynamic_meta(frame, s->hdr_dynamic_meta);
        s->hdr_dynamic = 0;
        if (s->raw_frame_header->show_existing_frame)
            fill_hdr_meta_to_frame(frame, MPP_VIDEO_CodingAV1);
    }
    mpp_frame_set_pts(frame, s->pts);
    mpp_buf_slot_set_flag(s->slots, s->cur_frame.slot_index, SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(s->slots, s->cur_frame.slot_index, QUEUE_DISPLAY);
    s->cur_frame.ref->is_output = 1;

    return ret;
}